

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

void Wln_NtkCreateRefs(Wln_Ntk_t *p)

{
  uint uVar1;
  Wln_Vec_t *pWVar2;
  int *piVar3;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar4;
  long lVar5;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar6;
  long lVar7;
  ulong uVar8;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar9;
  
  uVar1 = (p->vTypes).nCap;
  if ((p->vRefs).nCap < (int)uVar1) {
    piVar3 = (p->vRefs).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
    }
    (p->vRefs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vRefs).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vRefs).nSize = uVar1;
  if (1 < (p->vTypes).nSize) {
    pWVar2 = p->vFanins;
    paVar4 = &pWVar2[1].field_2;
    lVar5 = 1;
    do {
      uVar8 = (ulong)(uint)pWVar2[lVar5].nSize;
      if (0 < pWVar2[lVar5].nSize) {
        lVar7 = 0;
        paVar6 = paVar4;
        do {
          paVar9 = paVar6;
          if (2 < (int)uVar8) {
            paVar9 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                     (pWVar2[lVar5].field_2.pArray[0] + lVar7);
          }
          uVar1 = paVar9->Array[0];
          if ((ulong)uVar1 != 0) {
            if (((int)uVar1 < 0) || ((p->vRefs).nSize <= (int)uVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar3 = (p->vRefs).pArray + uVar1;
            *piVar3 = *piVar3 + 1;
          }
          lVar7 = lVar7 + 1;
          uVar8 = (ulong)pWVar2[lVar5].nSize;
          paVar6 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar6 + 4);
        } while (lVar7 < (long)uVar8);
      }
      lVar5 = lVar5 + 1;
      paVar4 = paVar4 + 2;
    } while (lVar5 < (p->vTypes).nSize);
  }
  return;
}

Assistant:

void Wln_NtkCreateRefs( Wln_Ntk_t * p )  
{
    int k, iObj, iFanin;
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjRefsInc( p, iFanin );
}